

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void ps_add(Curl_easy *data,easy_pollset *ps,int bitmap,curl_socket_t *socks)

{
  byte bVar1;
  int local_2c;
  int i;
  curl_socket_t *socks_local;
  int bitmap_local;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  
  if (bitmap != 0) {
    for (local_2c = 0;
        ((local_2c < 5 &&
         (bVar1 = (byte)local_2c, (bitmap & (1 << (bVar1 & 0x1f) | 1 << (bVar1 + 0x10 & 0x1f))) != 0
         )) && (-1 < socks[local_2c])); local_2c = local_2c + 1) {
      if ((bitmap & 1 << (bVar1 & 0x1f)) == 0) {
        Curl_pollset_change(data,ps,socks[local_2c],2,0);
      }
      else if ((bitmap & 1 << (bVar1 + 0x10 & 0x1f)) == 0) {
        Curl_pollset_change(data,ps,socks[local_2c],1,0);
      }
      else {
        Curl_pollset_change(data,ps,socks[local_2c],3,0);
      }
    }
  }
  return;
}

Assistant:

static void ps_add(struct Curl_easy *data, struct easy_pollset *ps,
                   int bitmap, curl_socket_t *socks)
{
  if(bitmap) {
    int i;
    for(i = 0; i < MAX_SOCKSPEREASYHANDLE; ++i) {
      if(!(bitmap & GETSOCK_MASK_RW(i)) || !VALID_SOCK((socks[i]))) {
        break;
      }
      if(bitmap & GETSOCK_READSOCK(i)) {
        if(bitmap & GETSOCK_WRITESOCK(i))
          Curl_pollset_add_inout(data, ps, socks[i]);
        else
          /* is READ, since we checked MASK_RW above */
          Curl_pollset_add_in(data, ps, socks[i]);
      }
      else
        Curl_pollset_add_out(data, ps, socks[i]);
    }
  }
}